

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameBase.cpp
# Opt level: O2

void __thiscall BayesianGameBase::Initialize(BayesianGameBase *this)

{
  _Rb_tree_header *p_Var1;
  pointer puVar2;
  pointer puVar3;
  size_t *psVar4;
  ostream *poVar5;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *this_00;
  map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  *pmVar6;
  size_type __n;
  ulong uVar7;
  uint uVar8;
  size_type sVar9;
  ulong uVar10;
  allocator_type local_41;
  bad_alloc anon_var_0;
  value_type_conflict3 local_28;
  
  if (this->_m_stepSizeTypes != (size_t *)0x0) {
    operator_delete__(this->_m_stepSizeTypes);
  }
  if (this->_m_stepSizeActions != (size_t *)0x0) {
    operator_delete__(this->_m_stepSizeActions);
  }
  psVar4 = IndexTools::CalculateStepSize(&this->_m_nrTypes);
  this->_m_stepSizeTypes = psVar4;
  psVar4 = IndexTools::CalculateStepSize(&this->_m_nrActions);
  this->_m_stepSizeActions = psVar4;
  this->_m_nrJTypes = 1;
  this->_m_nrJA = 1;
  puVar2 = (this->_m_nrActions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->_m_nrTypes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  __n = 1;
  sVar9 = 1;
  for (uVar8 = 0; uVar7 = (ulong)uVar8, uVar7 < this->_m_nrAgents; uVar8 = uVar8 + 1) {
    uVar10 = puVar3[uVar7] * __n;
    this->_m_nrJTypes = uVar10;
    if (uVar10 < __n) {
      this->_m_JToverflow = true;
    }
    uVar7 = puVar2[uVar7] * sVar9;
    this->_m_nrJA = uVar7;
    if (uVar7 < sVar9) {
      this->_m_JAoverflow = true;
    }
    __n = uVar10;
    sVar9 = uVar7;
  }
  if ((__n < 0x186a1) && (this->_m_JToverflow != true)) {
    this->_m_useSparse = false;
    local_28 = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&anon_var_0,__n,&local_28,&local_41);
    std::vector<double,_std::allocator<double>_>::_M_move_assign(&this->_m_jTypeProbs,&anon_var_0);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&anon_var_0);
    this_00 = (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)operator_new(0x18);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::vector(this_00,this->_m_nrJTypes,(allocator_type *)&anon_var_0);
    this->_m_jointToIndTypes = this_00;
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cout,"BayesianGameBase: using sparse models");
    std::endl<char,std::char_traits<char>>(poVar5);
    this->_m_useSparse = true;
  }
  if (this->_m_useSparse == true) {
    boost::numeric::ublas::
    mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
    ::resize(&this->_m_jTypeProbsSparse,this->_m_nrJTypes,true);
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_double>,_std::_Select1st<std::pair<const_unsigned_long,_double>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
    ::clear((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_double>,_std::_Select1st<std::pair<const_unsigned_long,_double>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
             *)&(this->_m_jTypeProbsSparse).data_);
    pmVar6 = (map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              *)operator_new(0x30);
    p_Var1 = &(pmVar6->_M_t)._M_impl.super__Rb_tree_header;
    *(undefined8 *)&(pmVar6->_M_t)._M_impl = 0;
    *(undefined8 *)&(pmVar6->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
    (pmVar6->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (pmVar6->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    (pmVar6->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    (pmVar6->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    (pmVar6->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    this->_m_jointToIndTypes =
         (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *)0x0;
  }
  else {
    pmVar6 = (map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              *)0x0;
  }
  this->_m_jointToIndTypesMap = pmVar6;
  GetNrJointPolicies(this);
  if (this->_m_JToverflow == true) {
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "BayesianGameBase::Initialize: Warning, joint types are overflowing");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  if (this->_m_JAoverflow == true) {
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "BayesianGameBase::Initialize: Warning, joint actions are overflowing")
    ;
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  this->_m_initialized = true;
  return;
}

Assistant:

void BayesianGameBase::Initialize()
{
    if(_m_stepSizeTypes)
        delete[] _m_stepSizeTypes;
    if(_m_stepSizeActions)
        delete[] _m_stepSizeActions;
    _m_stepSizeTypes = IndexTools::CalculateStepSize(_m_nrTypes);
    _m_stepSizeActions = IndexTools::CalculateStepSize(_m_nrActions);

    //calculate # joint types and actions
    _m_nrJTypes = 1;
    _m_nrJA = 1;
    for(Index i = 0; i < _m_nrAgents; i++)
    {
        size_t old_JT = _m_nrJTypes;
        _m_nrJTypes *= _m_nrTypes[i];
        if (old_JT > _m_nrJTypes)
            _m_JToverflow = true;
            //throw EOverflow("BayesianGameBase::Number of joint types are overflowing");

        size_t old_JA = _m_nrJA;
        _m_nrJA *= _m_nrActions[i];
        if (old_JA > _m_nrJA)
            _m_JAoverflow = true;
            //throw EOverflow("BayesianGameBase::Number of joint actions are overflowing");
    }

    if(_m_nrJTypes>1e5 || _m_JToverflow)
    {
        cout << "BayesianGameBase: using sparse models" << endl;
        _m_useSparse=true;
    }
    else
    {
        _m_useSparse=false;
        try {
            _m_jTypeProbs = vector<double>(_m_nrJTypes, 0.0);
            _m_jointToIndTypes = new vector<vector<Index> >(_m_nrJTypes);
        } catch(std::bad_alloc)
        {
            cout << "BayesianGameBase: too many joint types ("
                 << _m_nrJTypes
                 << ") to have a full vector in memory, switching to sparse models..." << endl;
            _m_useSparse=true;
        }
    }

    //initialize the probability distribution over joint types:
    if(_m_useSparse)
    {
        _m_jTypeProbsSparse.resize(_m_nrJTypes);
        _m_jTypeProbsSparse.clear();
        _m_jointToIndTypesMap = new map<Index, vector<Index> >();
        _m_jointToIndTypes=0;
    }
    else
    {
        _m_jointToIndTypesMap=0;
    }


    // call this as it checks whether the joint policy indices will be
    // overflowing, resulting in an exception
    try {
        GetNrJointPolicies();
    }
    catch(EOverflow& e){ 
        cout << "BayesianGameBase::Initialize: Warning, joint policy indices are overflowing (don't rely on enumaration of all joint policies!)" << endl;
    }
    if(_m_JToverflow)
        cout << "BayesianGameBase::Initialize: Warning, joint types are overflowing" << endl;
    if(_m_JAoverflow)
        cout << "BayesianGameBase::Initialize: Warning, joint actions are overflowing" << endl;

    _m_initialized=true;
}